

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_recharging(void)

{
  bool bVar1;
  _Bool _Var2;
  borg_item_conflict *pbVar3;
  char *pcVar4;
  borg_item_conflict *item;
  int local_10;
  _Bool charge;
  int i;
  
  if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
    for (local_10 = 0; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + 1) {
      pbVar3 = borg_items + local_10;
      if ((((pbVar3->iqty != '\0') && ((pbVar3->ident & 1U) != 0)) && ((pbVar3->aware & 1U) != 0))
         && ((pbVar3->note == (char *)0x0 ||
             (pcVar4 = strstr(pbVar3->note,"empty"), pcVar4 == (char *)0x0)))) {
        bVar1 = false;
        if ((pbVar3->tval == '\x17') && (pbVar3->pval < 2)) {
          bVar1 = true;
        }
        if (pbVar3->tval == '\x16') {
          if (((pbVar3->pval < 2) && (_Var2 = borg_spell_okay_fail(RECHARGING,0x60), _Var2)) &&
             ((int)(uint)pbVar3->sval < sv_staff_power)) {
            bVar1 = true;
          }
          if (pbVar3->pval < 2) {
            bVar1 = true;
          }
          if ((((uint)pbVar3->sval == sv_staff_teleportation) && (pbVar3->pval < 3)) &&
             (borg.trait[0x69] == 0)) {
            bVar1 = true;
          }
          if ((3 < (int)((uint)pbVar3->iqty + (int)pbVar3->pval)) && (0 < pbVar3->pval)) {
            bVar1 = false;
          }
        }
        if (bVar1) {
          _Var2 = borg_read_scroll(sv_scroll_recharging);
          if (((!_Var2) && (_Var2 = borg_spell_fail(RECHARGING,0x60), !_Var2)) &&
             (_Var2 = borg_activate_item(act_recharge), !_Var2)) {
            return false;
          }
          pcVar4 = format("Recharging %s with current charge of %d",pbVar3,
                          (ulong)(uint)(int)pbVar3->pval);
          borg_note(pcVar4);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_10]);
          if ((pbVar3->note != (char *)0x0) &&
             (pcVar4 = strstr(pbVar3->note,"empty"), pcVar4 != (char *)0x0)) {
            borg_deinscribe(local_10);
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool borg_recharging(void)
{
    int  i      = -1;
    bool charge = false;

    /* Forbid blind/confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* XXX XXX XXX Dark */

    /* Look for an item to recharge */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident || !item->aware)
            continue;

        if (item->note && strstr(item->note, "empty"))
            continue;

        /* assume we can't charge it. */
        charge = false;

        /* Wands with no charges can be charged */
        if ((item->tval == TV_WAND) && (item->pval <= 1))
            charge = true;

        /* recharge staves sometimes */
        if (item->tval == TV_STAFF) {
            /* Allow staves to be recharged at 2 charges if
             * the borg has the big recharge spell. And its not a *Dest*
             */
            if ((item->pval < 2) && (borg_spell_okay_fail(RECHARGING, 96))
                && item->sval < sv_staff_power)
                charge = true;

            /* recharge any staff at 0 charges */
            if (item->pval <= 1)
                charge = true;

            /* Staves of teleport get recharged at 2 charges in town */
            if ((item->sval == sv_staff_teleportation) && (item->pval < 3)
                && !borg.trait[BI_CDEPTH])
                charge = true;

            /* They stack.  If quantity is 4 and pval is 1, then there are 4
             * charges. */
            if ((item->iqty + item->pval >= 4) && item->pval >= 1)
                charge = false;
        }

        /* get the next item if we are not to charge this one */
        if (!charge)
            continue;

        /* Attempt to recharge */
        if (borg_read_scroll(sv_scroll_recharging)
            || borg_spell_fail(RECHARGING, 96)
            || borg_activate_item(act_recharge)) {
            /* Message */
            borg_note(format("Recharging %s with current charge of %d",
                item->desc, item->pval));

            /* Recharge the item */
            borg_keypress(all_letters_nohjkl[i]);

            /* Remove the {empty} if present */
            if (item->note && strstr(item->note, "empty"))
                borg_deinscribe(i);

            /* Success */
            return true;
        } else
            /* if we fail once, no need to try again. */
            break;
    }

    /* Nope */
    return false;
}